

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.h
# Opt level: O0

string * __thiscall
mvm::disassembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
disassemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_pipe<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)117,(char)115,(char)104,(char)0>>>
          (string *__return_storage_ptr__,
          disassembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *this)

{
  allocator<char> local_1a;
  undefined1 local_19;
  disassembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *local_18;
  disassembler<mvm::test::test_instr_set,_mvm::bytecode_serializer> *this_local;
  string *instr;
  
  local_19 = 0;
  local_18 = this;
  this_local = (disassembler<mvm::test::test_instr_set,_mvm::bytecode_serializer> *)
               __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"push",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  disassemble_operands<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_pipe<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)117,(char)115,(char)104,(char)0>>,0ul>
            (this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string disassembler<Set, MetaCodeImpl>::disassemble_instr() {
  std::string instr{typestring::char_seq<typename I::name_type>::value};

  LOG_INFO("disassembler -> disassemble instruction " << instr);

  if constexpr (concept ::is_code_consumer_v<I>) {
    using cc_type = typename I::bytecode_type;
    instr.push_back(' ');
    this->disassemble_operands<I>(
        instr, std::make_index_sequence<list::size_v<cc_type>>());
  }

  return instr;
}